

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench.cc
# Opt level: O2

Slice __thiscall
leveldb::anon_unknown_0::RandomGenerator::Generate(RandomGenerator *this,size_t len)

{
  ulong uVar1;
  int iVar2;
  Slice SVar3;
  
  iVar2 = this->pos_;
  uVar1 = (this->data_)._M_string_length;
  if (uVar1 < (long)iVar2 + len) {
    this->pos_ = 0;
    iVar2 = 0;
    if (uVar1 <= len) {
      __assert_fail("len < data_.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/benchmarks/db_bench.cc"
                    ,0x91,"Slice leveldb::(anonymous namespace)::RandomGenerator::Generate(size_t)")
      ;
    }
  }
  iVar2 = iVar2 + (int)len;
  this->pos_ = iVar2;
  SVar3.data_ = (this->data_)._M_dataplus._M_p + ((long)iVar2 - len);
  SVar3.size_ = len;
  return SVar3;
}

Assistant:

Slice Generate(size_t len) {
    if (pos_ + len > data_.size()) {
      pos_ = 0;
      assert(len < data_.size());
    }
    pos_ += len;
    return Slice(data_.data() + pos_ - len, len);
  }